

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QXmlStreamEntityDeclaration>::appendInitialize
          (QArrayDataPointer<QXmlStreamEntityDeclaration> *this,qsizetype newSize)

{
  QXmlStreamEntityDeclaration *pQVar1;
  long in_RSI;
  QXmlStreamEntityDeclaration *in_RDI;
  QXmlStreamEntityDeclaration *e;
  QXmlStreamEntityDeclaration *b;
  
  begin((QArrayDataPointer<QXmlStreamEntityDeclaration> *)0x6651a0);
  pQVar1 = begin((QArrayDataPointer<QXmlStreamEntityDeclaration> *)0x6651b6);
  std::uninitialized_value_construct<QXmlStreamEntityDeclaration*>(pQVar1 + in_RSI,in_RDI);
  (in_RDI->m_name).m_string.size = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }